

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack7_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  
  uVar3 = *(ulong *)in;
  auVar9._8_4_ = 0x7f;
  auVar9._0_8_ = 0x7f0000007f;
  auVar9._12_4_ = 0x7f;
  auVar10._16_4_ = 0x7f;
  auVar10._0_16_ = auVar9;
  auVar10._20_4_ = 0x7f;
  auVar10._24_4_ = 0x7f;
  auVar10._28_4_ = 0x7f;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar3;
  auVar7 = vpshufd_avx(auVar8,0x50);
  *out = (uint)uVar3 & 0x7f;
  uVar1 = in[2];
  auVar8 = vpshufd_avx(auVar8,0x55);
  auVar4 = vpermq_avx2(ZEXT1632(auVar7),0x50);
  auVar6 = vpsrlvd_avx2(auVar4,_DAT_0018e600);
  auVar7 = vpinsrd_avx(auVar9,((uint)(uVar3 >> 0x20) & 7) << 4,3);
  auVar8 = vpinsrd_avx(auVar8,uVar1,1);
  auVar8 = vpshufd_avx(auVar8,0x54);
  auVar5 = vpsrlvd_avx2(auVar8,_DAT_0019de50);
  auVar4 = vpand_avx2(auVar6,auVar10);
  auVar6 = vpor_avx2(auVar6,ZEXT1632(auVar7));
  auVar4 = vpblendd_avx2(auVar4,auVar6,8);
  *(undefined1 (*) [32])(out + 1) = auVar4;
  auVar7 = vpinsrd_avx(auVar9,uVar1 * 2 & 0x7e,0);
  uVar2 = in[3];
  auVar8 = vpor_avx(auVar5,auVar7);
  auVar7 = vpand_avx(auVar5,auVar9);
  auVar7 = vpblendd_avx2(auVar7,auVar8,1);
  *(undefined1 (*) [16])(out + 9) = auVar7;
  auVar7 = vpbroadcastd_avx512vl();
  auVar7 = vpsrlvd_avx2(auVar7,_DAT_0019de60);
  out[0xd] = uVar1 >> 0x1b | (uVar2 & 3) << 5;
  auVar7 = vpand_avx(auVar7,auVar9);
  *(long *)(out + 0xe) = auVar7._0_8_;
  return in + 4;
}

Assistant:

const uint32_t *__fastunpack7_16(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 7);
  out++;
  *out = ((*in) >> 7) % (1U << 7);
  out++;
  *out = ((*in) >> 14) % (1U << 7);
  out++;
  *out = ((*in) >> 21) % (1U << 7);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 3)) << (7 - 3);
  out++;
  *out = ((*in) >> 3) % (1U << 7);
  out++;
  *out = ((*in) >> 10) % (1U << 7);
  out++;
  *out = ((*in) >> 17) % (1U << 7);
  out++;
  *out = ((*in) >> 24) % (1U << 7);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 6)) << (7 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 7);
  out++;
  *out = ((*in) >> 13) % (1U << 7);
  out++;
  *out = ((*in) >> 20) % (1U << 7);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 2)) << (7 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 7);
  out++;
  *out = ((*in) >> 9) % (1U << 7);
  out++;

  return in + 1;
}